

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O1

double __thiscall
BeliefSparse::InnerProduct(BeliefSparse *this,vector<double,_std::allocator<double>_> *values)

{
  BS *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  BScit it;
  long local_40;
  long *local_38;
  long *local_28;
  
  this_00 = &this->_m_b;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find(this_00,0);
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find(this_00,(this->_m_b).size_);
  if (local_38 == local_28) {
    auVar2._0_8_ = 0.0;
  }
  else {
    auVar2 = ZEXT816(0);
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)((long)local_38 +
                               (*(long *)(local_40 + 0x40) - *(long *)(local_40 + 0x28)));
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[*local_38];
      auVar2 = vfmadd231sd_fma(auVar2,auVar3,auVar1);
      local_38 = local_38 + 1;
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::find(this_00,this_00->size_);
      auVar2._8_8_ = 0;
    } while (local_38 != local_28);
  }
  return auVar2._0_8_;
}

Assistant:

double BeliefSparse::InnerProduct(const vector<double> &values) const
{
#if BeliefSparse_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
    double x=0;
    for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
        x+=(*it)*values[it.index()];

    return(x);
}